

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

hts_itr_t *
hts_itr_querys(hts_idx_t *idx,char *reg,hts_name2id_f getid,void *hdr,hts_itr_query_func *itr_query,
              hts_readrec_func *readrec)

{
  long lVar1;
  void *pvVar2;
  hts_readrec_func *phVar3;
  hts_idx_t *phVar4;
  hts_itr_query_func *phVar5;
  int iVar6;
  char *pcVar7;
  hts_itr_t *phVar8;
  size_t __n;
  undefined8 uStack_60;
  void *local_58;
  hts_readrec_func *local_50;
  hts_idx_t *local_48;
  hts_itr_query_func *local_40;
  int local_38;
  int local_34;
  int beg;
  int end;
  
  uStack_60 = 0x11033d;
  local_58 = hdr;
  iVar6 = strcmp(reg,".");
  if (iVar6 == 0) {
    iVar6 = -3;
  }
  else {
    uStack_60 = 0x110358;
    local_40 = itr_query;
    iVar6 = strcmp(reg,"*");
    if (iVar6 != 0) {
      uStack_60 = 0x110378;
      local_50 = readrec;
      local_48 = idx;
      pcVar7 = hts_parse_reg(reg,&local_38,&local_34);
      pvVar2 = local_58;
      __n = (long)pcVar7 - (long)reg;
      lVar1 = -(__n + 0x10 & 0xfffffffffffffff0);
      pcVar7 = (char *)((long)&local_58 + lVar1);
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1103a4;
      strncpy(pcVar7,reg,__n);
      pcVar7[__n] = '\0';
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1103b2;
      iVar6 = (*getid)(pvVar2,pcVar7);
      if (iVar6 < 0) {
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1103bf;
        iVar6 = (*getid)(pvVar2,reg);
      }
      phVar5 = local_40;
      phVar4 = local_48;
      phVar3 = local_50;
      if (iVar6 < 0) {
        phVar8 = (hts_itr_t *)0x0;
      }
      else {
        *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1103da;
        phVar8 = (*phVar5)(phVar4,iVar6,local_38,local_34,phVar3);
      }
      return phVar8;
    }
    iVar6 = -2;
    itr_query = local_40;
  }
  phVar8 = (*itr_query)(idx,iVar6,0,0,readrec);
  return phVar8;
}

Assistant:

hts_itr_t *hts_itr_querys(const hts_idx_t *idx, const char *reg, hts_name2id_f getid, void *hdr, hts_itr_query_func *itr_query, hts_readrec_func *readrec)
{
    int tid, beg, end;
    char *q, *tmp;
    if (strcmp(reg, ".") == 0)
        return itr_query(idx, HTS_IDX_START, 0, 0, readrec);
    else if (strcmp(reg, "*") != 0) {
        q = (char*)hts_parse_reg(reg, &beg, &end);
        tmp = (char*)alloca(q - reg + 1);
        strncpy(tmp, reg, q - reg);
        tmp[q - reg] = 0;
        if ((tid = getid(hdr, tmp)) < 0)
            tid = getid(hdr, reg);
        if (tid < 0) return 0;
        return itr_query(idx, tid, beg, end, readrec);
    } else return itr_query(idx, HTS_IDX_NOCOOR, 0, 0, readrec);
}